

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::GetSyncInvalidSyncTest::iterate(GetSyncInvalidSyncTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  int iVar4;
  Library *pLVar5;
  TestError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  EGLint condition;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  pLVar5 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*pLVar5->_vptr_Library[0x24])(pLVar5,(this->super_SyncTest).m_eglDisplay,0,0x30f8);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," = eglGetSyncAttribKHR(",0x17);
  std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,", EGL_NO_SYNC_KHR, EGL_SYNC_CONDITION_KHR, {",0x2c);
  std::ostream::operator<<(poVar1,0xf0f0f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"})",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  iVar4 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = eglGetError()",0x10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
  if (iVar4 == 0x300c) {
    if (iVar3 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"result == EGL_FALSE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x36f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Unexpected error \'",0x12)
    ;
    local_1b8.m_getName = eglu::getErrorName;
    local_1b8.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected EGL_BAD_PARAMETER",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		EGLint condition = 0xF0F0F;
		EGLBoolean result = egl.getSyncAttribKHR(m_eglDisplay, EGL_NO_SYNC_KHR, EGL_SYNC_CONDITION_KHR, &condition);
		log << TestLog::Message << result << " = eglGetSyncAttribKHR(" << m_eglDisplay << ", EGL_NO_SYNC_KHR, EGL_SYNC_CONDITION_KHR, {" << condition << "})" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_PARAMETER)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_PARAMETER" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(result == EGL_FALSE);
		TCU_CHECK(condition == 0xF0F0F);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}